

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

int anon_unknown.dwarf_38f1ab::GetNextNumber(string *in,int *val,size_type *pos,size_type *pos2)

{
  int iVar1;
  size_type sVar2;
  long *local_48 [2];
  long local_38 [2];
  
  sVar2 = std::__cxx11::string::find((char)in,0x2c);
  *pos2 = sVar2;
  if (sVar2 == 0xffffffffffffffff) {
    if (in->_M_string_length == *pos) {
      *val = -1;
    }
    else {
      std::__cxx11::string::substr((ulong)local_48,(ulong)in);
      iVar1 = atoi((char *)local_48[0]);
      *val = iVar1;
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    iVar1 = 0;
  }
  else {
    if (sVar2 == *pos) {
      *val = -1;
    }
    else {
      std::__cxx11::string::substr((ulong)local_48,(ulong)in);
      iVar1 = atoi((char *)local_48[0]);
      *val = iVar1;
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    *pos = *pos2 + 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetNextNumber(std::string const& in, int& val,
                         std::string::size_type& pos,
                         std::string::size_type& pos2)
{
  pos2 = in.find(',', pos);
  if (pos2 != std::string::npos) {
    if (pos2 - pos == 0) {
      val = -1;
    } else {
      val = atoi(in.substr(pos, pos2 - pos).c_str());
    }
    pos = pos2 + 1;
    return 1;
  }
  if (in.size() - pos == 0) {
    val = -1;
  } else {
    val = atoi(in.substr(pos, in.size() - pos).c_str());
  }
  return 0;
}